

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::GL>
           *this,TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  long *plVar2;
  long lVar3;
  string shader_source;
  string invalid_initializers [7];
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  ulong uStack_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"    int x[2][2][0]; \n","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"    int x[2][0][2]; \n","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"    int x[0][2][2]; \n","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"    int x[2][0][0]; \n","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"    int x[0][2][0]; \n","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"    int x[0][0][2]; \n","");
  plVar2 = local_48;
  local_58[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"    int x[0][0][0]; \n","");
  lVar3 = 8;
  do {
    local_138 = &local_128;
    local_130 = 0;
    local_128 = 0;
    std::__cxx11::string::_M_assign((string *)&local_138);
    std::__cxx11::string::_M_append((char *)&local_138,*(ulong *)((long)&uStack_120 + lVar3));
    puVar1 = &set_tesseation_abi_cxx11_;
    switch((ulong)tested_shader_type) {
    case 0:
    case 2:
    case 5:
      break;
    case 1:
      std::__cxx11::string::append((char *)&local_138);
      break;
    case 3:
      puVar1 = &emit_quad_abi_cxx11_;
    case 4:
      std::__cxx11::string::_M_append((char *)&local_138,*puVar1);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x8ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_138,shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)tested_shader_type,&local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xe8);
  lVar3 = -0xe0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_initializers[] = { "    int x[2][2][0]; \n", "    int x[2][0][2]; \n", "    int x[0][2][2]; \n",
										   "    int x[2][0][0]; \n", "    int x[0][2][0]; \n", "    int x[0][0][2]; \n",
										   "    int x[0][0][0]; \n" };

	for (size_t invalid_initializers_index = 0;
		 invalid_initializers_index < sizeof(invalid_initializers) / sizeof(invalid_initializers[0]);
		 invalid_initializers_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_initializers[invalid_initializers_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_initializers_index = 0; ...) */
}